

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestCase::TestCase
          (TestCase *this,char *a_name,char *a_type_param,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc)

{
  allocator<char> *__s;
  allocator<char> *this_00;
  undefined8 in_RCX;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  allocator<char> *in_RDI;
  TestResult *this_01;
  undefined8 in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  bool local_4b;
  allocator<char> local_4a;
  undefined1 local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  allocator<char> local_29;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  
  *(undefined ***)in_RDI = &PTR__TestCase_002012c8;
  __s = in_RDI + 8;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__s,in_RDI);
  std::allocator<char>::~allocator(&local_29);
  this_00 = in_RDI + 0x28;
  local_49 = 0;
  if (local_18 == 0) {
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    local_49 = 1;
    local_48 = local_98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__s,in_RDI);
  }
  local_49 = 0;
  local_4b = local_18 != 0;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr((scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_00,local_98);
  if (local_4b) {
    std::allocator<char>::~allocator(&local_4a);
  }
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::vector
            ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)0x1807e8);
  this_01 = (TestResult *)(in_RDI + 0x48);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1807fb);
  *(undefined8 *)(in_RDI + 0x60) = local_20;
  *(undefined8 *)(in_RDI + 0x68) = local_28;
  in_RDI[0x70] = (allocator<char>)0x0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  TestResult::TestResult(this_01);
  return;
}

Assistant:

TestCase::TestCase(const char* a_name, const char* a_type_param,
                   Test::SetUpTestCaseFunc set_up_tc,
                   Test::TearDownTestCaseFunc tear_down_tc)
    : name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : NULL),
      set_up_tc_(set_up_tc),
      tear_down_tc_(tear_down_tc),
      should_run_(false),
      elapsed_time_(0) {
}